

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::add_sub<true,true,unsigned_int>
               (uint source,uint *destination,Status *status)

{
  uint uVar1;
  uint uVar2;
  FlagT FVar3;
  bool bVar4;
  
  uVar1 = *destination;
  uVar2 = uVar1 + source;
  FVar3 = (FlagT)CARRY4(uVar1,source);
  status->carry_flag = FVar3;
  if (status->extend_flag != 0) {
    bVar4 = uVar2 < uVar1;
    uVar2 = uVar2 + 1;
    FVar3 = (FlagT)(uVar2 == 0 || bVar4);
    status->carry_flag = FVar3;
  }
  status->extend_flag = FVar3;
  status->zero_result = status->zero_result | (ulong)uVar2;
  status->negative_flag = (ulong)(uVar2 & 0x80000000);
  status->overflow_flag = (ulong)(~(source ^ uVar1) & (uVar2 ^ uVar1) & 0x80000000);
  *destination = uVar2;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}